

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void Curl_conncontrol(connectdata *conn,int ctrl)

{
  _Bool _Var1;
  bool bVar2;
  
  _Var1 = Curl_conn_is_multiplex(conn,0);
  if (ctrl != 2 || !_Var1) {
    bVar2 = ctrl == 1 || ctrl == 2 && !_Var1;
    if ((((ulong)conn->bits & 0x20) == 0) == bVar2) {
      conn->bits = (ConnectBits)((ulong)conn->bits & 0xffffffffffffffdf | (ulong)bVar2 << 5);
    }
  }
  return;
}

Assistant:

const char *reason
#endif
  )
{
  /* close if a connection, or a stream that is not multiplexed. */
  /* This function will be called both before and after this connection is
     associated with a transfer. */
  bool closeit, is_multiplex;
  DEBUGASSERT(conn);
#if defined(DEBUGBUILD) && !defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void)reason; /* useful for debugging */
#endif
  is_multiplex = Curl_conn_is_multiplex(conn, FIRSTSOCKET);
  closeit = (ctrl == CONNCTRL_CONNECTION) ||
    ((ctrl == CONNCTRL_STREAM) && !is_multiplex);
  if((ctrl == CONNCTRL_STREAM) && is_multiplex)
    ;  /* stream signal on multiplex conn never affects close state */
  else if((bit)closeit != conn->bits.close) {
    conn->bits.close = closeit; /* the only place in the source code that
                                   should assign this bit */
  }
}